

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O3

bool Json::OurReader::containsNewLine(Location begin,Location end)

{
  bool bVar1;
  
  if (begin < end) {
    bVar1 = true;
    do {
      if (*begin == '\n') {
        return bVar1;
      }
      if (*begin == '\r') {
        return bVar1;
      }
      begin = begin + 1;
      bVar1 = begin < end;
    } while (begin != end);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool OurReader::containsNewLine(OurReader::Location begin, OurReader::Location end) {
  for (; begin < end; ++begin)
    if (*begin == '\n' || *begin == '\r')
      return true;
  return false;
}